

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderRead(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlParserCtxtPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlChar *str;
  int iVar4;
  int iVar5;
  xmlParserErrors code;
  xmlNodePtr pxVar6;
  xmlXIncludeCtxtPtr ctxt;
  long lVar7;
  _xmlNode *p_Var8;
  _xmlNode *p_Var9;
  xmlTextReaderState xVar10;
  xmlNodePtr cur;
  xmlNodePtr tmp;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  xVar10 = reader->state;
  if (xVar10 == XML_TEXTREADER_ERROR) {
    return -1;
  }
  reader->curnode = (xmlNodePtr)0x0;
  if (reader->doc != (xmlDocPtr)0x0) {
    if (xVar10 == XML_TEXTREADER_END) {
      return 0;
    }
    p_Var9 = reader->node;
    do {
      if (p_Var9 == (_xmlNode *)0x0) {
        p_Var8 = reader->doc->children;
        if (p_Var8 == (_xmlNode *)0x0) goto LAB_00176268;
LAB_001761fa:
        reader->node = p_Var8;
LAB_001761fe:
        xVar10 = XML_TEXTREADER_START;
        p_Var9 = p_Var8;
      }
      else if ((reader->state == XML_TEXTREADER_BACKTRACK) ||
              ((xVar1 = p_Var9->type, xVar1 < XML_XINCLUDE_END &&
               ((0x84020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
LAB_001761bf:
        p_Var8 = p_Var9->next;
        if (p_Var8 != (_xmlNode *)0x0) goto LAB_001761fa;
        p_Var8 = p_Var9->parent;
        if (p_Var8 == (_xmlNode *)0x0) {
          xVar10 = XML_TEXTREADER_END;
        }
        else {
          if ((p_Var8->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) {
LAB_00176268:
            reader->state = XML_TEXTREADER_END;
            return 0;
          }
          reader->node = p_Var8;
          reader->depth = reader->depth + -1;
          xVar10 = XML_TEXTREADER_BACKTRACK;
          p_Var9 = p_Var8;
        }
      }
      else {
        p_Var8 = p_Var9->children;
        if (p_Var8 != (_xmlNode *)0x0) {
          reader->node = p_Var8;
          reader->depth = reader->depth + 1;
          goto LAB_001761fe;
        }
        xVar10 = XML_TEXTREADER_BACKTRACK;
        if (xVar1 != XML_ATTRIBUTE_NODE) goto LAB_001761bf;
      }
      reader->state = xVar10;
      if (1 < p_Var9->type - XML_XINCLUDE_START) {
        return 1;
      }
    } while( true );
  }
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  if (reader->mode != 0) {
    iVar5 = reader->ctxt->nodeNr;
    cur = reader->node;
    goto LAB_00176311;
  }
  reader->mode = 1;
  do {
    iVar5 = xmlTextReaderPushData(reader);
    if (iVar5 < 0) goto LAB_001768e9;
    pxVar2 = reader->ctxt;
    if (pxVar2->node != (xmlNodePtr)0x0) {
      if (pxVar2->myDoc != (xmlDocPtr)0x0) {
        reader->node = pxVar2->myDoc->children;
      }
      if (reader->node == (xmlNodePtr)0x0) {
        reader->node = *pxVar2->nodeTab;
      }
      goto LAB_001762e8;
    }
  } while ((reader->mode != 3) && (reader->state != XML_TEXTREADER_DONE));
  if (pxVar2->myDoc != (xmlDocPtr)0x0) {
    reader->node = pxVar2->myDoc->children;
  }
  if (reader->node == (xmlNodePtr)0x0) {
LAB_001768e9:
    reader->mode = 2;
    reader->state = XML_TEXTREADER_ERROR;
    return -1;
  }
LAB_001762e8:
  reader->state = XML_TEXTREADER_ELEMENT;
  reader->depth = 0;
  pxVar2->parseMode = XML_PARSE_READER;
  cur = (xmlNodePtr)0x0;
  xVar10 = XML_TEXTREADER_START;
  iVar5 = 0;
  do {
    pxVar6 = reader->node;
    if ((((pxVar6 != (xmlNodePtr)0x0) && (pxVar6->next == (_xmlNode *)0x0)) &&
        (pxVar6->type - XML_TEXT_NODE < 2)) &&
       (pxVar6 = xmlTextReaderExpand(reader), pxVar6 == (xmlNodePtr)0x0)) {
      return -1;
    }
    if (((((reader->xinclude != 0) && (reader->in_xinclude == 0)) &&
         ((reader->state != XML_TEXTREADER_BACKTRACK &&
          ((pxVar6 = reader->node, pxVar6 != (xmlNodePtr)0x0 && (pxVar6->type == XML_ELEMENT_NODE)))
          ))) && (pxVar6->ns != (xmlNs *)0x0)) &&
       ((iVar4 = xmlStrEqual(pxVar6->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar4 != 0 ||
        (iVar4 = xmlStrEqual(reader->node->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar4 != 0)))) {
      if (reader->xincctxt == (xmlXIncludeCtxtPtr)0x0) {
        ctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
        reader->xincctxt = ctxt;
        if (ctxt == (xmlXIncludeCtxtPtr)0x0) {
          xmlTextReaderErrMemory(reader);
          return -1;
        }
        xmlXIncludeSetFlags(ctxt,reader->parserFlags & 0xffff7fff);
        xmlXIncludeSetStreamingMode(reader->xincctxt,1);
        if ((reader->errorFunc != (xmlTextReaderErrorFunc)0x0) ||
           (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0)) {
          xmlXIncludeSetErrorHandler(reader->xincctxt,xmlTextReaderStructuredRelay,reader);
        }
        if (reader->resourceLoader != (xmlResourceLoader)0x0) {
          xmlXIncludeSetResourceLoader(reader->xincctxt,reader->resourceLoader,reader->resourceCtxt)
          ;
        }
      }
      pxVar6 = xmlTextReaderExpand(reader);
      if (pxVar6 == (xmlNodePtr)0x0) {
        return -1;
      }
      iVar4 = xmlXIncludeProcessNode(reader->xincctxt,reader->node);
      if (iVar4 < 0) {
        code = xmlXIncludeGetLastError(reader->xincctxt);
        iVar5 = xmlIsCatastrophicError(3,code);
        if (iVar5 == 0) {
          return -1;
        }
        xmlFatalErr(reader->ctxt,code,(char *)0x0);
        goto LAB_00176927;
      }
    }
    pxVar6 = reader->node;
    if (pxVar6 == (xmlNodePtr)0x0) {
LAB_001767c0:
      pxVar6 = reader->node;
      if (((pxVar6 == (xmlNodePtr)0x0) || (pxVar6->type != XML_ENTITY_DECL)) ||
         ((reader->ent == (xmlNodePtr)0x0 || (reader->ent->children != pxVar6)))) {
        if ((pxVar6 != (xmlNodePtr)0x0) && (reader->validate != XML_TEXTREADER_NOT_VALIDATE)) {
          if ((pxVar6->type == XML_ELEMENT_NODE) &&
             ((reader->state != XML_TEXTREADER_END && (reader->state != XML_TEXTREADER_BACKTRACK))))
          {
            iVar5 = xmlTextReaderValidatePush(reader);
            if (iVar5 < 0) {
              return -1;
            }
          }
          else if (pxVar6->type - XML_TEXT_NODE < 2) {
            str = pxVar6->content;
            iVar5 = xmlStrlen(str);
            xmlTextReaderValidateCData(reader,str,iVar5);
          }
        }
        if ((((reader->patternNr < 1) || (reader->state == XML_TEXTREADER_END)) ||
            (reader->state == XML_TEXTREADER_BACKTRACK)) || (reader->patternNr < 1))
        goto LAB_001769f8;
        lVar7 = 0;
        break;
      }
      iVar4 = reader->entNr;
      lVar7 = (long)iVar4;
      pxVar6 = (xmlNodePtr)0x0;
      if (0 < lVar7) {
        reader->entNr = iVar4 + -1;
        pxVar6 = (xmlNodePtr)0x0;
        if (iVar4 != 1) {
          pxVar6 = reader->entTab[lVar7 + -2];
        }
        reader->ent = pxVar6;
        pxVar6 = reader->entTab[lVar7 + -1];
        reader->entTab[lVar7 + -1] = (xmlNodePtr)0x0;
      }
      reader->node = pxVar6;
      reader->depth = reader->depth + 1;
    }
    else {
      if (pxVar6->type != XML_XINCLUDE_START) {
        if (pxVar6 != (xmlNodePtr)0x0) {
          if (pxVar6->type == XML_XINCLUDE_END) {
            reader->in_xinclude = reader->in_xinclude + -1;
            goto LAB_00176311;
          }
          if (pxVar6 != (xmlNodePtr)0x0) {
            if (((pxVar6->type == XML_ENTITY_REF_NODE) && (reader->ctxt != (xmlParserCtxtPtr)0x0))
               && (reader->ctxt->replaceEntities == 1)) {
              p_Var9 = pxVar6->children;
              if (((p_Var9 != (_xmlNode *)0x0) && (p_Var9->type == XML_ENTITY_DECL)) &&
                 (p_Var9->children != (_xmlNode *)0x0)) {
                iVar4 = xmlTextReaderEntPush(reader,pxVar6);
                if (iVar4 < 0) goto LAB_00176311;
                reader->node = reader->node->children->children;
              }
            }
            else if (((pxVar6 != (xmlNodePtr)0x0) && (pxVar6->type == XML_ENTITY_REF_NODE)) &&
                    ((reader->ctxt != (xmlParserCtxtPtr)0x0 &&
                     ((reader->validate != XML_TEXTREADER_NOT_VALIDATE &&
                      (iVar4 = xmlTextReaderValidateEntity(reader), iVar4 < 0)))))) {
              return -1;
            }
          }
        }
        goto LAB_001767c0;
      }
      reader->in_xinclude = reader->in_xinclude + 1;
    }
LAB_00176311:
    if (reader->node == (xmlNodePtr)0x0) {
      if (reader->mode == 3) {
        return 0;
      }
      goto LAB_001768e9;
    }
    while (((((pxVar6 = reader->node, pxVar6 != (xmlNodePtr)0x0 && (pxVar6->next == (_xmlNode *)0x0)
              ) && (pxVar2 = reader->ctxt, pxVar2->nodeNr == iVar5)) &&
            (((((xVar10 == XML_TEXTREADER_BACKTRACK ||
                (p_Var9 = pxVar6->children, p_Var9 == (_xmlNode *)0x0)) ||
               (xVar1 = pxVar6->type, xVar1 == XML_ENTITY_REF_NODE)) ||
              ((p_Var9->type == XML_TEXT_NODE && (p_Var9->next == (_xmlNode *)0x0)))) ||
             ((xVar1 < XML_ELEMENT_DECL &&
              ((0x6200U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))))) &&
           ((((pxVar3 = pxVar2->node, pxVar3 == pxVar6 || pxVar3 == (xmlNodePtr)0x0 ||
              (pxVar3 == pxVar6->parent)) && (pxVar2->instate != XML_PARSER_EOF)) &&
            (pxVar2->disableSAX < 2))))) {
      iVar4 = xmlTextReaderPushData(reader);
      if (iVar4 < 0) goto LAB_00176927;
      if (reader->node == (xmlNodePtr)0x0) goto LAB_001763c1;
    }
    if (((xVar10 == XML_TEXTREADER_BACKTRACK) || (pxVar6->children == (_xmlNode *)0x0)) ||
       ((pxVar6->type < XML_XINCLUDE_END &&
        ((0x84020U >> (pxVar6->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
      if (pxVar6->next == (_xmlNode *)0x0) {
        if ((((xVar10 == XML_TEXTREADER_ELEMENT) && (pxVar6->type == XML_ELEMENT_NODE)) &&
            (pxVar6->children == (_xmlNode *)0x0)) && ((pxVar6->extra & 1) == 0)) goto LAB_001764f8;
        if (((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (pxVar6->type == XML_ELEMENT_NODE)
            ) && (iVar4 = xmlTextReaderValidatePop(reader), iVar4 < 0)) {
          return -1;
        }
        if ((0 < reader->preserves) && ((reader->node->extra & 4) != 0)) {
          reader->preserves = reader->preserves + -1;
        }
        p_Var9 = reader->node->parent;
        reader->node = p_Var9;
        if ((p_Var9 == (_xmlNode *)0x0) ||
           ((p_Var9->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE)) {
          if (reader->mode != 3) {
            iVar5 = xmlParseChunk(reader->ctxt,"",0,1);
            reader->state = XML_TEXTREADER_DONE;
            if (iVar5 != 0) {
LAB_00176927:
              reader->mode = 2;
              reader->state = XML_TEXTREADER_ERROR;
              return -1;
            }
          }
          reader->node = (xmlNodePtr)0x0;
          reader->depth = -1;
          if (((((cur != (xmlNodePtr)0x0) && (reader->preserves == 0)) && (reader->in_xinclude == 0)
               ) && ((reader->entNr == 0 && (cur->type != XML_DTD_NODE)))) &&
             ((cur->extra & 2) == 0)) {
            xmlUnlinkNode(cur);
            xmlTextReaderFreeNode(reader,cur);
          }
LAB_001763c1:
          reader->state = XML_TEXTREADER_DONE;
          return 0;
        }
        if (((reader->preserves == 0) && (reader->in_xinclude == 0)) &&
           ((reader->entNr == 0 &&
            ((pxVar6 = p_Var9->last, pxVar6 != (xmlNodePtr)0x0 && ((pxVar6->extra & 2) == 0)))))) {
          xmlUnlinkNode(pxVar6);
          xmlTextReaderFreeNode(reader,pxVar6);
        }
        reader->depth = reader->depth + -1;
        reader->state = XML_TEXTREADER_BACKTRACK;
      }
      else if ((((xVar10 == XML_TEXTREADER_ELEMENT) && (pxVar6->type == XML_ELEMENT_NODE)) &&
               (pxVar6->children == (_xmlNode *)0x0)) &&
              (((pxVar6->extra & 1) == 0 && (reader->in_xinclude < 1)))) {
LAB_001764f8:
        reader->state = XML_TEXTREADER_END;
        xVar10 = XML_TEXTREADER_ELEMENT;
      }
      else {
        if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
           ((pxVar6->type == XML_ELEMENT_NODE &&
            (iVar4 = xmlTextReaderValidatePop(reader), iVar4 < 0)))) {
          return -1;
        }
        if ((0 < reader->preserves) && ((reader->node->extra & 4) != 0)) {
          reader->preserves = reader->preserves + -1;
        }
        p_Var9 = reader->node->next;
        reader->node = p_Var9;
        reader->state = XML_TEXTREADER_ELEMENT;
        if ((((reader->preserves == 0) && (reader->in_xinclude == 0)) && (reader->entNr == 0)) &&
           (((pxVar6 = p_Var9->prev, pxVar6 != (xmlNodePtr)0x0 && (pxVar6->type != XML_DTD_NODE)) &&
            ((pxVar6->extra & 2) == 0)))) {
          if (cur == pxVar6) {
            cur = (xmlNodePtr)0x0;
          }
          xmlUnlinkNode(pxVar6);
          xmlTextReaderFreeNode(reader,pxVar6);
        }
      }
    }
    else {
      reader->node = pxVar6->children;
      reader->depth = reader->depth + 1;
      reader->state = XML_TEXTREADER_ELEMENT;
    }
  } while( true );
  while (lVar7 = lVar7 + 1, lVar7 < reader->patternNr) {
    iVar5 = xmlPatternMatch(reader->patternTab[lVar7],reader->node);
    if (iVar5 == 1) {
      xmlTextReaderPreserve(reader);
      break;
    }
  }
LAB_001769f8:
  if (((reader->validate == XML_TEXTREADER_VALIDATE_XSD) && (reader->xsdValidErrors == 0)) &&
     (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0)) {
    iVar5 = xmlSchemaIsValid(reader->xsdValidCtxt);
    reader->xsdValidErrors = (uint)(iVar5 == 0);
  }
  return 1;
}

Assistant:

int
xmlTextReaderRead(xmlTextReaderPtr reader) {
    int val, olddepth = 0;
    xmlTextReaderState oldstate = XML_TEXTREADER_START;
    xmlNodePtr oldnode = NULL;

    if (reader == NULL)
	return(-1);
    if (reader->state == XML_TEXTREADER_ERROR)
        return(-1);

    reader->curnode = NULL;
    if (reader->doc != NULL)
        return(xmlTextReaderReadTree(reader));
    if (reader->ctxt == NULL)
	return(-1);

    if (reader->mode == XML_TEXTREADER_MODE_INITIAL) {
	reader->mode = XML_TEXTREADER_MODE_INTERACTIVE;
	/*
	 * Initial state
	 */
	do {
	    val = xmlTextReaderPushData(reader);
            if (val < 0) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
                return(-1);
            }
	} while ((reader->ctxt->node == NULL) &&
		 ((reader->mode != XML_TEXTREADER_MODE_EOF) &&
		  (reader->state != XML_TEXTREADER_DONE)));
	if (reader->ctxt->node == NULL) {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
		return(-1);
	    }
	    reader->state = XML_TEXTREADER_ELEMENT;
	} else {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL)
		reader->node = reader->ctxt->nodeTab[0];
	    reader->state = XML_TEXTREADER_ELEMENT;
	}
	reader->depth = 0;
	reader->ctxt->parseMode = XML_PARSE_READER;
	goto node_found;
    }
    oldstate = reader->state;
    olddepth = reader->ctxt->nodeNr;
    oldnode = reader->node;

get_next_node:
    if (reader->node == NULL) {
	if (reader->mode == XML_TEXTREADER_MODE_EOF) {
	    return(0);
        } else {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
        }
    }

    /*
     * If we are not backtracking on ancestors or examined nodes,
     * that the parser didn't finished or that we aren't at the end
     * of stream, continue processing.
     */
    while ((reader->node != NULL) && (reader->node->next == NULL) &&
	   (reader->ctxt->nodeNr == olddepth) &&
           ((oldstate == XML_TEXTREADER_BACKTRACK) ||
            (reader->node->children == NULL) ||
	    (reader->node->type == XML_ENTITY_REF_NODE) ||
	    ((reader->node->children != NULL) &&
	     (reader->node->children->type == XML_TEXT_NODE) &&
	     (reader->node->children->next == NULL)) ||
	    (reader->node->type == XML_DTD_NODE) ||
	    (reader->node->type == XML_DOCUMENT_NODE) ||
	    (reader->node->type == XML_HTML_DOCUMENT_NODE)) &&
	   ((reader->ctxt->node == NULL) ||
	    (reader->ctxt->node == reader->node) ||
	    (reader->ctxt->node == reader->node->parent)) &&
	   (reader->ctxt->instate != XML_PARSER_EOF) &&
	   (PARSER_STOPPED(reader->ctxt) == 0)) {
	val = xmlTextReaderPushData(reader);
	if (val < 0) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
        }
	if (reader->node == NULL)
	    goto node_end;
    }
    if (oldstate != XML_TEXTREADER_BACKTRACK) {
	if ((reader->node->children != NULL) &&
	    (reader->node->type != XML_ENTITY_REF_NODE) &&
	    (reader->node->type != XML_XINCLUDE_START) &&
	    (reader->node->type != XML_DTD_NODE)) {
	    reader->node = reader->node->children;
	    reader->depth++;
	    reader->state = XML_TEXTREADER_ELEMENT;
	    goto node_found;
	}
    }
    if (reader->node->next != NULL) {
	if ((oldstate == XML_TEXTREADER_ELEMENT) &&
            (reader->node->type == XML_ELEMENT_NODE) &&
	    (reader->node->children == NULL) &&
	    ((reader->node->extra & NODE_IS_EMPTY) == 0)
#ifdef LIBXML_XINCLUDE_ENABLED
	    && (reader->in_xinclude <= 0)
#endif
	    ) {
	    reader->state = XML_TEXTREADER_END;
	    goto node_found;
	}
#ifdef LIBXML_REGEXP_ENABLED
	if ((reader->validate) &&
	    (reader->node->type == XML_ELEMENT_NODE))
	    if (xmlTextReaderValidatePop(reader) < 0)
                return(-1);
#endif /* LIBXML_REGEXP_ENABLED */
        if ((reader->preserves > 0) &&
	    (reader->node->extra & NODE_IS_SPRESERVED))
	    reader->preserves--;
	reader->node = reader->node->next;
	reader->state = XML_TEXTREADER_ELEMENT;

	/*
	 * Cleanup of the old node
	 */
	if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (reader->node->prev != NULL) &&
            (reader->node->prev->type != XML_DTD_NODE)) {
	    xmlNodePtr tmp = reader->node->prev;
	    if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
                if (oldnode == tmp)
                    oldnode = NULL;
		xmlUnlinkNode(tmp);
		xmlTextReaderFreeNode(reader, tmp);
	    }
	}

	goto node_found;
    }
    if ((oldstate == XML_TEXTREADER_ELEMENT) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->children == NULL) &&
	((reader->node->extra & NODE_IS_EMPTY) == 0)) {;
	reader->state = XML_TEXTREADER_END;
	goto node_found;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
        (reader->node->type == XML_ELEMENT_NODE)) {
        if (xmlTextReaderValidatePop(reader) < 0)
            return(-1);
    }
#endif /* LIBXML_REGEXP_ENABLED */
    if ((reader->preserves > 0) &&
	(reader->node->extra & NODE_IS_SPRESERVED))
	reader->preserves--;
    reader->node = reader->node->parent;
    if ((reader->node == NULL) ||
	(reader->node->type == XML_DOCUMENT_NODE) ||
	(reader->node->type == XML_HTML_DOCUMENT_NODE)) {
	if (reader->mode != XML_TEXTREADER_MODE_EOF) {
	    val = xmlParseChunk(reader->ctxt, "", 0, 1);
	    reader->state = XML_TEXTREADER_DONE;
	    if (val != 0) {
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
	        return(-1);
            }
	}
	reader->node = NULL;
	reader->depth = -1;

	/*
	 * Cleanup of the old node
	 */
	if ((oldnode != NULL) && (reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (oldnode->type != XML_DTD_NODE) &&
	    ((oldnode->extra & NODE_IS_PRESERVED) == 0)) {
	    xmlUnlinkNode(oldnode);
	    xmlTextReaderFreeNode(reader, oldnode);
	}

	goto node_end;
    }
    if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
        (reader->in_xinclude == 0) &&
#endif
	(reader->entNr == 0) &&
        (reader->node->last != NULL) &&
        ((reader->node->last->extra & NODE_IS_PRESERVED) == 0)) {
	xmlNodePtr tmp = reader->node->last;
	xmlUnlinkNode(tmp);
	xmlTextReaderFreeNode(reader, tmp);
    }
    reader->depth--;
    reader->state = XML_TEXTREADER_BACKTRACK;

node_found:
    /*
     * If we are in the middle of a piece of CDATA make sure it's finished
     */
    if ((reader->node != NULL) &&
        (reader->node->next == NULL) &&
        ((reader->node->type == XML_TEXT_NODE) ||
	 (reader->node->type == XML_CDATA_SECTION_NODE))) {
            if (xmlTextReaderExpand(reader) == NULL)
	        return -1;
    }

#ifdef LIBXML_XINCLUDE_ENABLED
    /*
     * Handle XInclude if asked for
     */
    if ((reader->xinclude) && (reader->in_xinclude == 0) &&
        (reader->state != XML_TEXTREADER_BACKTRACK) &&
        (reader->node != NULL) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->ns != NULL) &&
	((xmlStrEqual(reader->node->ns->href, XINCLUDE_NS)) ||
	 (xmlStrEqual(reader->node->ns->href, XINCLUDE_OLD_NS)))) {
	if (reader->xincctxt == NULL) {
	    reader->xincctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
            if (reader->xincctxt == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    xmlXIncludeSetFlags(reader->xincctxt,
	                        reader->parserFlags & (~XML_PARSE_NOXINCNODE));
            xmlXIncludeSetStreamingMode(reader->xincctxt, 1);
            if ((reader->errorFunc != NULL) || (reader->sErrorFunc != NULL))
                xmlXIncludeSetErrorHandler(reader->xincctxt,
                        xmlTextReaderStructuredRelay, reader);
            if (reader->resourceLoader != NULL)
                xmlXIncludeSetResourceLoader(reader->xincctxt,
                        reader->resourceLoader, reader->resourceCtxt);
	}
	/*
	 * expand that node and process it
	 */
	if (xmlTextReaderExpand(reader) == NULL)
	    return(-1);
        if (xmlXIncludeProcessNode(reader->xincctxt, reader->node) < 0) {
            int err = xmlXIncludeGetLastError(reader->xincctxt);

            if (xmlIsCatastrophicError(XML_ERR_FATAL, err)) {
                xmlFatalErr(reader->ctxt, err, NULL);
                reader->mode = XML_TEXTREADER_MODE_ERROR;
                reader->state = XML_TEXTREADER_ERROR;
            }
            return(-1);
        }
    }
    if ((reader->node != NULL) && (reader->node->type == XML_XINCLUDE_START)) {
        reader->in_xinclude++;
	goto get_next_node;
    }
    if ((reader->node != NULL) && (reader->node->type == XML_XINCLUDE_END)) {
        reader->in_xinclude--;
	goto get_next_node;
    }
#endif
    /*
     * Handle entities enter and exit when in entity replacement mode
     */
    if ((reader->node != NULL) &&
	(reader->node->type == XML_ENTITY_REF_NODE) &&
	(reader->ctxt != NULL) && (reader->ctxt->replaceEntities == 1)) {
	if ((reader->node->children != NULL) &&
	    (reader->node->children->type == XML_ENTITY_DECL) &&
	    (reader->node->children->children != NULL)) {
	    if (xmlTextReaderEntPush(reader, reader->node) < 0)
                goto get_next_node;
	    reader->node = reader->node->children->children;
	}
#ifdef LIBXML_REGEXP_ENABLED
    } else if ((reader->node != NULL) &&
	       (reader->node->type == XML_ENTITY_REF_NODE) &&
	       (reader->ctxt != NULL) && (reader->validate)) {
	if (xmlTextReaderValidateEntity(reader) < 0)
            return(-1);
#endif /* LIBXML_REGEXP_ENABLED */
    }
    if ((reader->node != NULL) &&
	(reader->node->type == XML_ENTITY_DECL) &&
	(reader->ent != NULL) && (reader->ent->children == reader->node)) {
	reader->node = xmlTextReaderEntPop(reader);
	reader->depth++;
        goto get_next_node;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node != NULL)) {
	xmlNodePtr node = reader->node;

	if ((node->type == XML_ELEMENT_NODE) &&
            ((reader->state != XML_TEXTREADER_END) &&
	     (reader->state != XML_TEXTREADER_BACKTRACK))) {
	    if (xmlTextReaderValidatePush(reader) < 0)
                return(-1);
	} else if ((node->type == XML_TEXT_NODE) ||
		   (node->type == XML_CDATA_SECTION_NODE)) {
            xmlTextReaderValidateCData(reader, node->content,
	                               xmlStrlen(node->content));
	}
    }
#endif /* LIBXML_REGEXP_ENABLED */
#ifdef LIBXML_PATTERN_ENABLED
    if ((reader->patternNr > 0) && (reader->state != XML_TEXTREADER_END) &&
        (reader->state != XML_TEXTREADER_BACKTRACK)) {
        int i;
	for (i = 0;i < reader->patternNr;i++) {
	     if (xmlPatternMatch(reader->patternTab[i], reader->node) == 1) {
	         xmlTextReaderPreserve(reader);
		 break;
             }
	}
    }
#endif /* LIBXML_PATTERN_ENABLED */
#ifdef LIBXML_SCHEMAS_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_XSD) &&
        (reader->xsdValidErrors == 0) &&
	(reader->xsdValidCtxt != NULL)) {
	reader->xsdValidErrors = !xmlSchemaIsValid(reader->xsdValidCtxt);
    }
#endif /* LIBXML_PATTERN_ENABLED */
    return(1);
node_end:
    reader->state = XML_TEXTREADER_DONE;
    return(0);
}